

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O2

int Curl_strcasecompare(char *first,char *second)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  
  lVar3 = 0;
  while( true ) {
    cVar1 = first[lVar3];
    cVar2 = second[lVar3];
    if ((cVar1 == '\0') || (cVar2 == '\0')) break;
    cVar4 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar4 = cVar1;
    }
    cVar5 = cVar2 + -0x20;
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      cVar5 = cVar2;
    }
    if (cVar4 != cVar5) break;
    lVar3 = lVar3 + 1;
  }
  cVar4 = cVar1 + -0x20;
  if (0x19 < (byte)(cVar1 + 0x9fU)) {
    cVar4 = cVar1;
  }
  if ((byte)(cVar2 + 0x9fU) < 0x1a) {
    cVar2 = cVar2 + -0x20;
  }
  return (int)(cVar4 == cVar2);
}

Assistant:

int Curl_strcasecompare(const char *first, const char *second)
{
  while(*first && *second) {
    if(Curl_raw_toupper(*first) != Curl_raw_toupper(*second))
      /* get out of the loop as soon as they don't match */
      break;
    first++;
    second++;
  }
  /* we do the comparison here (possibly again), just to make sure that if the
     loop above is skipped because one of the strings reached zero, we must not
     return this as a successful match */
  return (Curl_raw_toupper(*first) == Curl_raw_toupper(*second));
}